

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler.c
# Opt level: O2

void WebPRescalerImportRowShrink_C(WebPRescaler *wrk,uint8_t *src)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int accum;
  int iVar4;
  ulong uVar5;
  int x_out;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  uVar9 = wrk->num_channels;
  lVar2 = (long)(int)uVar9;
  iVar1 = wrk->dst_width;
  uVar3 = 0;
  uVar5 = 0;
  if (0 < (int)uVar9) {
    uVar5 = (ulong)uVar9;
  }
  for (; uVar3 != uVar5; uVar3 = uVar3 + 1) {
    uVar7 = 0;
    iVar4 = 0;
    uVar8 = uVar3;
    for (uVar6 = uVar3; (long)uVar6 < iVar1 * lVar2; uVar6 = uVar6 + lVar2) {
      uVar8 = (ulong)(int)uVar8;
      uVar9 = 0;
      for (iVar4 = iVar4 + wrk->x_add; 0 < iVar4; iVar4 = iVar4 - wrk->x_sub) {
        uVar9 = (uint)src[uVar8];
        uVar7 = (ulong)((int)uVar7 + (uint)src[uVar8]);
        uVar8 = uVar8 + lVar2;
      }
      wrk->frow[uVar6] = (int)uVar7 * wrk->x_sub + uVar9 * iVar4;
      uVar7 = (ulong)wrk->fx_scale * (ulong)-(uVar9 * iVar4) + 0x80000000 >> 0x20;
    }
  }
  return;
}

Assistant:

void WebPRescalerImportRowShrink_C(WebPRescaler* const wrk,
                                   const uint8_t* src) {
  const int x_stride = wrk->num_channels;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  int channel;
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);
  for (channel = 0; channel < x_stride; ++channel) {
    int x_in = channel;
    int x_out = channel;
    uint32_t sum = 0;
    int accum = 0;
    while (x_out < x_out_max) {
      uint32_t base = 0;
      accum += wrk->x_add;
      while (accum > 0) {
        accum -= wrk->x_sub;
        assert(x_in < wrk->src_width * x_stride);
        base = src[x_in];
        sum += base;
        x_in += x_stride;
      }
      {        // Emit next horizontal pixel.
        const rescaler_t frac = base * (-accum);
        wrk->frow[x_out] = sum * wrk->x_sub - frac;
        // fresh fractional start for next pixel
        sum = (int)MULT_FIX(frac, wrk->fx_scale);
      }
      x_out += x_stride;
    }
    assert(accum == 0);
  }
}